

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidVertexGeometry(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ON_BrepVertex *pOVar4;
  ON_BrepVertex *vertex;
  ON_TextLog *text_log_local;
  int vertex_index_local;
  ON_Brep *this_local;
  
  if ((vertex_index < 0) ||
     (iVar2 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     iVar2 <= vertex_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar3 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                        (ulong)(uint)vertex_index,(ulong)uVar3);
    }
    return false;
  }
  pOVar4 = ON_ClassArray<ON_BrepVertex>::operator[]
                     ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,vertex_index);
  if (pOVar4->m_vertex_index != vertex_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar4->m_vertex_index,(ulong)(uint)vertex_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  bVar1 = ON_3dPoint::IsValid(&(pOVar4->super_ON_Point).point);
  if (!bVar1) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex geometry is not valid.\n",
                        (ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.point = (%g,%g,%g) is not valid.\n",
                        (pOVar4->super_ON_Point).point.x,(pOVar4->super_ON_Point).point.y,
                        (pOVar4->super_ON_Point).point.z);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  return true;
}

Assistant:

bool
ON_Brep::IsValidVertexGeometry( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return false;
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return false;
  }

  if ( !vertex.point.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex geometry is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.point = (%g,%g,%g) is not valid.\n",vertex.point.x,vertex.point.y,vertex.point.z );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}